

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::CommandLineInterfaceTester
          (CommandLineInterfaceTester *this)

{
  string *name;
  undefined8 uVar1;
  bool bVar2;
  Nonnull<const_char_*> failure_msg;
  tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_d0;
  long local_c8;
  LogMessageFatal local_b0 [3];
  string local_80;
  AlphaNum local_60;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CommandLineInterfaceTester_0053a570;
  CommandLineInterface::CommandLineInterface(&this->cli_);
  (this->temp_directory_)._M_dataplus._M_p = (pointer)&(this->temp_directory_).field_2;
  (this->temp_directory_)._M_string_length = 0;
  (this->temp_directory_).field_2._M_local_buf[0] = '\0';
  (this->captured_stderr_)._M_dataplus._M_p = (pointer)&(this->captured_stderr_).field_2;
  (this->captured_stderr_)._M_string_length = 0;
  (this->captured_stderr_).field_2._M_local_buf[0] = '\0';
  (this->captured_stdout_)._M_dataplus._M_p = (pointer)&(this->captured_stdout_).field_2;
  (this->captured_stdout_)._M_string_length = 0;
  name = &this->temp_directory_;
  (this->captured_stdout_).field_2._M_local_buf[0] = '\0';
  (this->generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TestTempDir_abi_cxx11_();
  local_b0[0].super_LogMessage._0_8_ = local_c8;
  local_b0[0].super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )local_d0.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl;
  local_60.piece_ = absl::lts_20250127::NullSafeStringView("/proto2_cli_test_temp");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_80,(lts_20250127 *)local_b0,&local_60,&local_60);
  std::__cxx11::string::operator=((string *)name,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar2 = File::Exists(name);
  if (bVar2) {
    File::DeleteRecursively(name,(void *)0x0,(void *)0x0);
  }
  File::CreateDir((File *)local_b0,name,0x1ff);
  uVar1 = local_b0[0].super_LogMessage._0_8_;
  if (local_b0[0].super_LogMessage._0_8_ == 1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)local_b0,
                             "File::CreateDir(temp_directory_, 0777) is OK");
  }
  absl::lts_20250127::Status::~Status((Status *)local_b0);
  if (uVar1 == 1) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
             ,0x32,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(local_b0);
}

Assistant:

CommandLineInterfaceTester::CommandLineInterfaceTester() {
  temp_directory_ = absl::StrCat(TestTempDir(), "/proto2_cli_test_temp");

  // If the temp directory already exists, it must be left over from a
  // previous run.  Delete it.
  if (FileExists(temp_directory_)) {
    File::DeleteRecursively(temp_directory_, NULL, NULL);
  }

  // Create the temp directory.
  ABSL_CHECK_OK(File::CreateDir(temp_directory_, 0777));
}